

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_write_nonblock.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  in_addr_t iVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  time_t tVar10;
  long lVar11;
  ulong uVar12;
  time_t tVar13;
  fd_set *__writefds;
  fd_set *__readfds;
  undefined1 *__ptr;
  long lVar14;
  timeval timeout;
  sockaddr_in sin;
  char mem [102400];
  long lStack_190f8;
  int iStack_190f0;
  timeval tStack_190d8;
  fd_set fStack_190c8;
  sockaddr sStack_19048;
  undefined1 auStack_19038 [102408];
  
  iVar3 = 0x100007f;
  if (1 < argc) {
    iVar3 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    sftppath = argv[5];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 == 0) {
    __stream = fopen(loclfile,"rb");
    if (__stream != (FILE *)0x0) {
      __fd = socket(2,1,0);
      if (__fd == -1) {
        main_cold_6();
      }
      else {
        sStack_19048.sa_family = 2;
        sStack_19048.sa_data[0] = '\0';
        sStack_19048.sa_data[1] = '\x16';
        sStack_19048.sa_data._2_4_ = iVar3;
        iVar5 = connect(__fd,&sStack_19048,0x10);
        if (iVar5 == 0) {
          lVar6 = libssh2_session_init_ex(0,0,0,0);
          if (lVar6 != 0) {
            libssh2_session_set_blocking(lVar6,0);
            do {
              uVar4 = libssh2_session_handshake(lVar6,__fd);
            } while (uVar4 == 0xffffffdb);
            if (uVar4 == 0) {
              lVar7 = libssh2_hostkey_hash(lVar6,2);
              fwrite("Fingerprint: ",0xd,1,_stderr);
              lVar14 = 0;
              do {
                fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar14));
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x14);
              fputc(10,_stderr);
              do {
                pcVar1 = username;
                sVar8 = strlen(username);
                pcVar2 = password;
                sVar9 = strlen(password);
                iVar5 = libssh2_userauth_password_ex
                                  (lVar6,pcVar1,sVar8 & 0xffffffff,pcVar2,sVar9 & 0xffffffff,0);
              } while (iVar5 == -0x25);
              if (iVar5 == 0) {
                fwrite("libssh2_sftp_init().\n",0x15,1,_stderr);
                do {
                  lVar7 = libssh2_sftp_init(lVar6);
                  if (lVar7 != 0) {
                    fwrite("libssh2_sftp_open().\n",0x15,1,_stderr);
                    goto LAB_00101727;
                  }
                  iVar5 = libssh2_session_last_errno(lVar6);
                } while (iVar5 == -0x25);
                main_cold_3();
              }
              else {
                main_cold_4();
              }
            }
            else {
              fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
            }
            goto LAB_00101531;
          }
          main_cold_5();
        }
        else {
          main_cold_1();
        }
      }
      lVar6 = 0;
      goto LAB_00101531;
    }
    main_cold_7();
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
  }
  return 1;
  while (iVar5 = libssh2_session_last_errno(lVar6), iVar5 == -0x25) {
LAB_00101727:
    pcVar1 = sftppath;
    sVar8 = strlen(sftppath);
    lVar14 = libssh2_sftp_open_ex(lVar7,pcVar1,sVar8 & 0xffffffff,0x1a,0x1a4,0);
    if (lVar14 != 0) {
      fwrite("libssh2_sftp_open() is done, now send data.\n",0x2c,1,_stderr);
      tVar10 = time((time_t *)0x0);
      iVar5 = __fd + 0x3f;
      if (-1 < __fd) {
        iVar5 = __fd;
      }
      lStack_190f8 = 0;
      goto LAB_001017e2;
    }
  }
  main_cold_2();
  goto LAB_00101531;
LAB_001017e2:
  do {
    __ptr = auStack_19038;
    sVar9 = fread(__ptr,1,0x19000,__stream);
    sVar8 = sVar9;
    if (sVar9 == 0) break;
    do {
      while (lVar11 = libssh2_sftp_write(lVar14,__ptr,sVar8), lVar11 == -0x25) {
        tStack_190d8.tv_sec = 10;
        tStack_190d8.tv_usec = 0;
        fStack_190c8.fds_bits[0] = 0;
        fStack_190c8.fds_bits[1] = 0;
        fStack_190c8.fds_bits[2] = 0;
        fStack_190c8.fds_bits[3] = 0;
        fStack_190c8.fds_bits[4] = 0;
        fStack_190c8.fds_bits[5] = 0;
        fStack_190c8.fds_bits[6] = 0;
        fStack_190c8.fds_bits[7] = 0;
        fStack_190c8.fds_bits[8] = 0;
        fStack_190c8.fds_bits[9] = 0;
        fStack_190c8.fds_bits[10] = 0;
        fStack_190c8.fds_bits[0xb] = 0;
        fStack_190c8.fds_bits[0xc] = 0;
        fStack_190c8.fds_bits[0xd] = 0;
        fStack_190c8.fds_bits[0xe] = 0;
        fStack_190c8.fds_bits[0xf] = 0;
        fStack_190c8.fds_bits[iVar5 >> 6] =
             fStack_190c8.fds_bits[iVar5 >> 6] | 1L << ((byte)__fd & 0x3f);
        uVar12 = libssh2_session_block_directions(lVar6);
        __readfds = (fd_set *)0x0;
        if ((uVar12 & 1) != 0) {
          __readfds = &fStack_190c8;
        }
        __writefds = (fd_set *)0x0;
        if ((uVar12 & 2) != 0) {
          __writefds = &fStack_190c8;
        }
        select(__fd + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_190d8);
      }
      if (lVar11 < 0) break;
      __ptr = __ptr + lVar11;
      sVar8 = sVar8 - lVar11;
    } while (sVar8 != 0);
    lStack_190f8 = lStack_190f8 + sVar9;
  } while (0 < lVar11);
  tVar13 = time((time_t *)0x0);
  iStack_190f0 = (int)tVar10;
  uVar4 = (int)tVar13 - iStack_190f0;
  fprintf(_stderr,"%ld bytes in %d seconds makes %.1f bytes/sec\n",
          SUB84((double)lStack_190f8 / (double)(int)uVar4,0),lStack_190f8,(ulong)uVar4);
  libssh2_sftp_close_handle(lVar14);
  libssh2_sftp_shutdown(lVar7);
LAB_00101531:
  fclose(__stream);
  if (lVar6 != 0) {
    do {
      iVar5 = libssh2_session_disconnect_ex(lVar6,0xb,"Normal Shutdown","");
    } while (iVar5 == -0x25);
    libssh2_session_free(lVar6);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    ssize_t nwritten;
    char *ptr;
    time_t start;
    libssh2_struct_stat_size total = 0;
    int duration;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        sftppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init().\n");
    do {
        sftp_session = libssh2_sftp_init(session);

        if(!sftp_session &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to init SFTP session\n");
            goto shutdown;
        }
    } while(!sftp_session);

    fprintf(stderr, "libssh2_sftp_open().\n");
    /* Request a file via SFTP */
    do {
        sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                        LIBSSH2_FXF_WRITE |
                                        LIBSSH2_FXF_CREAT |
                                        LIBSSH2_FXF_TRUNC,
                                        LIBSSH2_SFTP_S_IRUSR |
                                        LIBSSH2_SFTP_S_IWUSR |
                                        LIBSSH2_SFTP_S_IRGRP |
                                        LIBSSH2_SFTP_S_IROTH);
        if(!sftp_handle &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                    libssh2_sftp_last_error(sftp_session));
            goto shutdown;
        }
    } while(!sftp_handle);

    fprintf(stderr, "libssh2_sftp_open() is done, now send data.\n");
    start = time(NULL);
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        total += (libssh2_struct_stat_size)nread;

        do {
            /* write data in a loop until we block */
            while((nwritten = libssh2_sftp_write(sftp_handle, ptr, nread)) ==
                  LIBSSH2_ERROR_EAGAIN) {
                waitsocket(sock, session);
            }
            if(nwritten < 0)
                break;
            ptr += nwritten;
            nread -= (size_t)nwritten;
        } while(nread);
    } while(nwritten > 0);

    duration = (int)(time(NULL) - start);

    fprintf(stderr, "%ld bytes in %d seconds makes %.1f bytes/sec\n",
            (long)total, duration, (double)total / duration);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    fclose(local);

    if(session) {
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}